

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O1

void libtorrent::heterogeneous_queue<libtorrent::alert>::move<libtorrent::read_piece_alert>
               (char *dst,char *src)

{
  int *piVar1;
  long *plVar2;
  int iVar3;
  
  read_piece_alert::read_piece_alert((read_piece_alert *)dst,(read_piece_alert *)src);
  boost::detail::shared_count::~shared_count((shared_count *)(src + 0x48));
  *(undefined ***)src = &PTR__torrent_alert_004ebb90;
  plVar2 = *(long **)(src + 0x18);
  if (plVar2 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)plVar2 + 0xc);
      iVar3 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = *(int *)((long)plVar2 + 0xc);
      *(int *)((long)plVar2 + 0xc) = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (**(code **)(*plVar2 + 0x18))();
    }
  }
  alert::~alert((alert *)src);
  return;
}

Assistant:

static void move(char* dst, char* src) noexcept
		{
			static_assert(std::is_nothrow_move_constructible<U>::value
				, "heterogeneous queue only supports noexcept move constructible types");
			static_assert(std::is_nothrow_destructible<U>::value
				, "heterogeneous queue only supports noexcept destructible types");
			U& rhs = *reinterpret_cast<U*>(src);

			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(dst) & (alignof(U) - 1)) == 0);

			new (dst) U(std::move(rhs));
			rhs.~U();
		}